

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O3

void anon_unknown.dwarf_1d31b4::readImage(char *inFileName)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  Header *pHVar4;
  int *piVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  AcesInputFile in;
  Header h;
  allocator<char> local_99;
  Rgba local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  Header local_68 [56];
  
  local_88[0] = (long *)0x0;
  Imf_3_2::Header::Header(local_68,0x40,0x40,1.0,(Vec2 *)local_88,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading file ",0xd);
  if (inFileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1f3f58);
  }
  else {
    sVar3 = strlen(inFileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,inFileName,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,inFileName,&local_99);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::AcesInputFile::AcesInputFile((AcesInputFile *)local_98,(string *)local_88,iVar2);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  pHVar4 = (Header *)Imf_3_2::AcesInputFile::header();
  Imf_3_2::Header::operator=(local_68,pHVar4);
  piVar5 = (int *)Imf_3_2::Header::dataWindow();
  iVar2 = *piVar5;
  iVar1 = piVar5[1];
  lVar8 = ((long)piVar5[2] - (long)iVar2) + 1;
  uVar6 = ((piVar5[3] - iVar1) + 1) * lVar8;
  pvVar7 = operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
  Imf_3_2::AcesInputFile::setFrameBuffer
            (local_98,(long)pvVar7 + (long)((int)lVar8 * iVar1) * -8 + (long)iVar2 * -8,1);
  Imf_3_2::AcesInputFile::readPixels((int)local_98,iVar1);
  Imf_3_2::AcesInputFile::~AcesInputFile((AcesInputFile *)local_98);
  Imf_3_2::Header::~Header(local_68);
  operator_delete__(pvVar7);
  return;
}

Assistant:

void
readImage (const char inFileName[])
{
    Array2D<Rgba> p;
    Header        h;
    Box2i         dw;
    int           width;
    int           height;

    {
        cout << "Reading file " << inFileName << endl;

        AcesInputFile in (inFileName);

        h  = in.header ();
        dw = h.dataWindow ();

        width  = dw.max.x - dw.min.x + 1;
        height = dw.max.y - dw.min.y + 1;
        p.resizeErase (height, width);

        in.setFrameBuffer (&p[0][0] - dw.min.x - dw.min.y * width, 1, width);
        in.readPixels (dw.min.y, dw.max.y);
    }
}